

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pxVar2 = xmlXPathTryStreamCompile(ctxt->context,ctxt->base);
  if (pxVar2 == (xmlXPathCompExprPtr)0x0) {
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      ctxt->context->depth = 0;
    }
    xmlXPathCompileExpr(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      xmlXPathErr(ctxt,7);
      return;
    }
    pxVar2 = ctxt->comp;
    if ((1 < pxVar2->nbStep) && (iVar1 = pxVar2->last, -1 < (long)iVar1)) {
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        ctxt->context->depth = 0;
      }
      xmlXPathOptimizeExpression(ctxt,pxVar2->steps + iVar1);
    }
  }
  else {
    if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(ctxt->comp);
    }
    ctxt->comp = pxVar2;
  }
  xmlXPathRunEval(ctxt,0);
  return;
}

Assistant:

void
xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt) {
#ifdef XPATH_STREAMING
    xmlXPathCompExprPtr comp;
#endif

    if (ctxt == NULL) return;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt->context, ctxt->base);
    if (comp != NULL) {
        if (ctxt->comp != NULL)
	    xmlXPathFreeCompExpr(ctxt->comp);
        ctxt->comp = comp;
    } else
#endif
    {
        if (ctxt->context != NULL)
            ctxt->context->depth = 0;
	xmlXPathCompileExpr(ctxt, 1);
        CHECK_ERROR;

        /* Check for trailing characters. */
        if (*ctxt->cur != 0)
            XP_ERROR(XPATH_EXPR_ERROR);

	if ((ctxt->comp->nbStep > 1) && (ctxt->comp->last >= 0)) {
            if (ctxt->context != NULL)
                ctxt->context->depth = 0;
	    xmlXPathOptimizeExpression(ctxt,
		&ctxt->comp->steps[ctxt->comp->last]);
        }
    }

    xmlXPathRunEval(ctxt, 0);
}